

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  cmProcess *pcVar6;
  reference __rhs;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  string *psVar10;
  reference pbVar11;
  double testTimeOut;
  double timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  string local_908 [32];
  ostringstream local_8e8 [8];
  ostringstream cmCTestLog_msg_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  string local_748 [32];
  undefined1 local_728 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_5b0 [8];
  string file;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  iterator i;
  undefined1 local_560 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3e8 [8];
  string msg_1;
  undefined1 local_3a8 [8];
  ostringstream cmCTestLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  _Self local_210;
  _Self local_208;
  const_iterator it;
  string local_1f8 [8];
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  int local_1b0;
  int local_19c;
  undefined1 local_198 [8];
  ostringstream cmCTestLog_msg;
  size_t total_local;
  cmCTestRunTest *this_local;
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  iVar3 = getNumWidth(total);
  local_19c = (int)std::setw(iVar3 * 2 + 8);
  poVar4 = std::operator<<((ostream *)local_198,(_Setw)local_19c);
  poVar4 = std::operator<<(poVar4,"Start ");
  iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
  iVar3 = getNumWidth((long)iVar3);
  local_1b0 = (int)std::setw(iVar3);
  poVar4 = std::operator<<(poVar4,(_Setw)local_1b0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1aa,pcVar5,false);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::__cxx11::string::clear();
  if ((this->TestProperties->Disabled & 1U) == 0) {
    ComputeArguments(this);
    msg.field_2._8_8_ = &this->TestProperties->Args;
    (this->TestResult).Properties = this->TestProperties;
    (this->TestResult).ExecutionTime = 0.0;
    (this->TestResult).CompressOutput = false;
    (this->TestResult).ReturnValue = -1;
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).CompletionStatus,"Failed to start");
    (this->TestResult).Status = 8;
    (this->TestResult).TestCount = this->TestProperties->Index;
    std::__cxx11::string::operator=((string *)&this->TestResult,(string *)this->TestProperties);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).Path,(string *)&this->TestProperties->Directory);
    bVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->FailedDependencies);
    if (bVar2) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)msg.field_2._8_8_);
      if (1 < sVar7) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg.field_2._8_8_,1);
        bVar2 = std::operator==(pvVar8,"NOT_AVAILABLE");
        if (bVar2) {
          pcVar6 = (cmProcess *)operator_new(0xc0);
          cmProcess::cmProcess(pcVar6);
          this->TestProcess = pcVar6;
          std::__cxx11::string::string(local_3e8);
          cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            std::__cxx11::string::operator=(local_3e8,"Test not available in configuration \"");
            psVar10 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
            std::__cxx11::string::operator+=(local_3e8,(string *)psVar10);
            std::__cxx11::string::operator+=(local_3e8,"\".");
          }
          else {
            std::__cxx11::string::operator=(local_3e8,"Test not available without configuration.");
            std::__cxx11::string::operator+=(local_3e8,"  (Missing \"-C <config>\"?)");
          }
          poVar4 = std::operator<<(this->TestHandler->LogFile,local_3e8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
          poVar4 = std::operator<<((ostream *)local_560,local_3e8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x1e7,pcVar5,false);
          std::__cxx11::string::~string((string *)&i);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
          std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_3e8);
          std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).CompletionStatus,"Missing Configuration");
          (this->TestResult).Status = 0;
          this_local._7_1_ = 0;
          std::__cxx11::string::~string(local_3e8);
          goto LAB_0062fcd3;
        }
      }
      local_588._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->TestProperties->RequiredFiles);
      while( true ) {
        file.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->TestProperties->RequiredFiles);
        bVar2 = __gnu_cxx::operator!=
                          (&local_588,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&file.field_2 + 8));
        if (!bVar2) break;
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_588);
        std::__cxx11::string::string((string *)local_5b0,(string *)pbVar11);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileExists(pcVar5);
        if (!bVar2) {
          pcVar6 = (cmProcess *)operator_new(0xc0);
          cmProcess::cmProcess(pcVar6);
          this->TestProcess = pcVar6;
          poVar4 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
          poVar4 = std::operator<<(poVar4,(string *)local_5b0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
          poVar4 = std::operator<<((ostream *)local_728,"Unable to find required file: ");
          poVar4 = std::operator<<(poVar4,(string *)local_5b0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x1fb,pcVar5,false);
          std::__cxx11::string::~string(local_748);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
          std::operator+(&local_768,"Unable to find required file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b0);
          std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_768)
          ;
          std::__cxx11::string::~string((string *)&local_768);
          std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).CompletionStatus,"Required Files Missing");
          (this->TestResult).Status = 0;
          this_local._7_1_ = 0;
        }
        std::__cxx11::string::~string((string *)local_5b0);
        if (!bVar2) goto LAB_0062fcd3;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_588);
      }
      bVar2 = std::operator==(&this->ActualCommand,"");
      if (bVar2) {
        pcVar6 = (cmProcess *)operator_new(0xc0);
        cmProcess::cmProcess(pcVar6);
        this->TestProcess = pcVar6;
        poVar4 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg.field_2._8_8_,1);
        poVar4 = std::operator<<(poVar4,(string *)pvVar8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream(local_8e8);
        poVar4 = std::operator<<((ostream *)local_8e8,"Unable to find executable: ");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg.field_2._8_8_,1);
        poVar4 = std::operator<<(poVar4,(string *)pvVar8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x20b,pcVar5,false);
        std::__cxx11::string::~string(local_908);
        std::__cxx11::ostringstream::~ostringstream(local_8e8);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg.field_2._8_8_,1);
        std::operator+(&local_928,"Unable to find executable: ",pvVar8);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_928);
        std::__cxx11::string::~string((string *)&local_928);
        std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,"Unable to find executable");
        (this->TestResult).Status = 0;
        this_local._7_1_ = 0;
      }
      else {
        cmCTest::CurrentTime_abi_cxx11_((string *)&timeout,this->CTest);
        std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&timeout);
        std::__cxx11::string::~string((string *)&timeout);
        testTimeOut = ResolveTimeout(this);
        if ((this->StopTimePassed & 1U) == 0) {
          this_local._7_1_ =
               ForkProcess(this,testTimeOut,(bool)(this->TestProperties->ExplicitTimeout & 1),
                           &this->TestProperties->Environment);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
    else {
      pcVar6 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar6);
      this->TestProcess = pcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f8,"Failed test dependencies:",(allocator *)((long)&it._M_node + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
      local_208._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->FailedDependencies);
      while( true ) {
        local_210._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->FailedDependencies);
        bVar2 = std::operator!=(&local_208,&local_210);
        if (!bVar2) break;
        __rhs = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_208);
        std::operator+(&local_230," ",__rhs);
        std::__cxx11::string::operator+=(local_1f8,(string *)&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_208);
      }
      poVar4 = std::operator<<(this->TestHandler->LogFile,local_1f8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar4 = std::operator<<((ostream *)local_3a8,local_1f8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x1d3,pcVar5,false);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_1f8);
      std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).CompletionStatus,"Fixture dependency failed");
      (this->TestResult).Status = 0;
      this_local._7_1_ = 0;
      std::__cxx11::string::~string(local_1f8);
    }
  }
  else {
    (this->TestResult).Properties = this->TestProperties;
    (this->TestResult).ExecutionTime = 0.0;
    (this->TestResult).CompressOutput = false;
    (this->TestResult).ReturnValue = -1;
    std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Disabled");
    (this->TestResult).Status = 0;
    (this->TestResult).TestCount = this->TestProperties->Index;
    std::__cxx11::string::operator=((string *)&this->TestResult,(string *)this->TestProperties);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).Path,(string *)&this->TestProperties->Directory);
    pcVar6 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar6);
    this->TestProcess = pcVar6;
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,"Disabled");
    std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,"");
    this_local._7_1_ = 0;
  }
LAB_0062fcd3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2 * getNumWidth(total) + 8)
               << "Start "
               << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
               << this->TestProperties->Index << ": "
               << this->TestProperties->Name << std::endl);
  this->ProcessOutput.clear();

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.Properties = this->TestProperties;
    this->TestResult.ExecutionTime = 0;
    this->TestResult.CompressOutput = false;
    this->TestResult.ReturnValue = -1;
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.TestCount = this->TestProperties->Index;
    this->TestResult.Name = this->TestProperties->Name;
    this->TestResult.Path = this->TestProperties->Directory;
    this->TestProcess = new cmProcess;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine = "";
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  if (!this->FailedDependencies.empty()) {
    this->TestProcess = new cmProcess;
    std::string msg = "Failed test dependencies:";
    for (std::set<std::string>::const_iterator it =
           this->FailedDependencies.begin();
         it != this->FailedDependencies.end(); ++it) {
      msg += " " + *it;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = new cmProcess;
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::vector<std::string>::iterator i =
         this->TestProperties->RequiredFiles.begin();
       i != this->TestProperties->RequiredFiles.end(); ++i) {
    std::string file = *i;

    if (!cmSystemTools::FileExists(file.c_str())) {
      // Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand == "") {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if (this->StopTimePassed) {
    return false;
  }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}